

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Orphan<capnp::DynamicStruct> * __thiscall
capnp::Orphan<capnp::DynamicValue>::releaseAs<capnp::DynamicStruct>
          (Orphan<capnp::DynamicStruct> *__return_storage_ptr__,Orphan<capnp::DynamicValue> *this)

{
  Fault f;
  Fault local_10;
  
  if (this->type == STRUCT) {
    this->type = UNKNOWN;
    (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)(this->field_1).intValue
    ;
    _::OrphanBuilder::OrphanBuilder(&__return_storage_ptr__->builder,&this->builder);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
             ,0x852,FAILED,"type == DynamicValue::STRUCT","\"Value type mismatch.\"",
             (char (*) [21])"Value type mismatch.");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

Orphan<DynamicStruct> Orphan<DynamicValue>::releaseAs<DynamicStruct>() {
  KJ_REQUIRE(type == DynamicValue::STRUCT, "Value type mismatch.");
  type = DynamicValue::UNKNOWN;
  return Orphan<DynamicStruct>(structSchema, kj::mv(builder));
}